

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Pooling3DLayerParams::MergeFrom
          (Pooling3DLayerParams *this,Pooling3DLayerParams *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6a33);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->type_ != 0) {
    this->type_ = from->type_;
  }
  if (from->kerneldepth_ != 0) {
    this->kerneldepth_ = from->kerneldepth_;
  }
  if (from->kernelheight_ != 0) {
    this->kernelheight_ = from->kernelheight_;
  }
  if (from->kernelwidth_ != 0) {
    this->kernelwidth_ = from->kernelwidth_;
  }
  if (from->stridedepth_ != 0) {
    this->stridedepth_ = from->stridedepth_;
  }
  if (from->strideheight_ != 0) {
    this->strideheight_ = from->strideheight_;
  }
  if (from->stridewidth_ != 0) {
    this->stridewidth_ = from->stridewidth_;
  }
  if (from->custompaddingfront_ != 0) {
    this->custompaddingfront_ = from->custompaddingfront_;
  }
  if (from->custompaddingback_ != 0) {
    this->custompaddingback_ = from->custompaddingback_;
  }
  if (from->custompaddingtop_ != 0) {
    this->custompaddingtop_ = from->custompaddingtop_;
  }
  if (from->custompaddingbottom_ != 0) {
    this->custompaddingbottom_ = from->custompaddingbottom_;
  }
  if (from->custompaddingleft_ != 0) {
    this->custompaddingleft_ = from->custompaddingleft_;
  }
  if (from->custompaddingright_ != 0) {
    this->custompaddingright_ = from->custompaddingright_;
  }
  if (from->countexcludepadding_ == true) {
    this->countexcludepadding_ = true;
  }
  if (from->paddingtype_ != 0) {
    this->paddingtype_ = from->paddingtype_;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Pooling3DLayerParams::MergeFrom(const Pooling3DLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Pooling3DLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_type() != 0) {
    _internal_set_type(from._internal_type());
  }
  if (from._internal_kerneldepth() != 0) {
    _internal_set_kerneldepth(from._internal_kerneldepth());
  }
  if (from._internal_kernelheight() != 0) {
    _internal_set_kernelheight(from._internal_kernelheight());
  }
  if (from._internal_kernelwidth() != 0) {
    _internal_set_kernelwidth(from._internal_kernelwidth());
  }
  if (from._internal_stridedepth() != 0) {
    _internal_set_stridedepth(from._internal_stridedepth());
  }
  if (from._internal_strideheight() != 0) {
    _internal_set_strideheight(from._internal_strideheight());
  }
  if (from._internal_stridewidth() != 0) {
    _internal_set_stridewidth(from._internal_stridewidth());
  }
  if (from._internal_custompaddingfront() != 0) {
    _internal_set_custompaddingfront(from._internal_custompaddingfront());
  }
  if (from._internal_custompaddingback() != 0) {
    _internal_set_custompaddingback(from._internal_custompaddingback());
  }
  if (from._internal_custompaddingtop() != 0) {
    _internal_set_custompaddingtop(from._internal_custompaddingtop());
  }
  if (from._internal_custompaddingbottom() != 0) {
    _internal_set_custompaddingbottom(from._internal_custompaddingbottom());
  }
  if (from._internal_custompaddingleft() != 0) {
    _internal_set_custompaddingleft(from._internal_custompaddingleft());
  }
  if (from._internal_custompaddingright() != 0) {
    _internal_set_custompaddingright(from._internal_custompaddingright());
  }
  if (from._internal_countexcludepadding() != 0) {
    _internal_set_countexcludepadding(from._internal_countexcludepadding());
  }
  if (from._internal_paddingtype() != 0) {
    _internal_set_paddingtype(from._internal_paddingtype());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}